

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall CTcTokenizer::copytok(CTcTokenizer *this,CTcToken *dst,CTcToken *src)

{
  ulong uVar1;
  tc_toktyp_t tVar2;
  undefined4 uVar3;
  int iVar4;
  char *pcVar5;
  
  dst->field_0x20 = src->field_0x20;
  tVar2 = src->typ_;
  uVar3 = *(undefined4 *)&src->field_0x4;
  pcVar5 = src->text_;
  uVar1 = src->int_val_;
  dst->text_len_ = src->text_len_;
  dst->int_val_ = uVar1;
  dst->typ_ = tVar2;
  *(undefined4 *)&dst->field_0x4 = uVar3;
  dst->text_ = pcVar5;
  iVar4 = is_tok_safe(this,src->typ_);
  if (iVar4 == 0) {
    pcVar5 = store_source(this,dst->text_,dst->text_len_);
    dst->text_ = pcVar5;
  }
  return;
}

Assistant:

void CTcTokenizer::copytok(CTcToken *dst, const CTcToken *src)
{
    /* start with an exact copy of the token */
    *dst = *src;

    /* if the token is a symbol, it already has a safe copy */
    if (is_tok_safe(src->gettyp()))
        return;

    /* save the token's text in permanent tokenizer memory */
    dst->set_text(store_source(dst->get_text(), dst->get_text_len()),
                  dst->get_text_len());
}